

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.hh
# Opt level: O3

intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>
__thiscall
tchecker::pool_t<tchecker::make_shared_t<tchecker::zg::transition_t,unsigned_long,1ul>>::
construct<unsigned_int_const&,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vedge_t,unsigned_long,1ul>>>
          (pool_t<tchecker::make_shared_t<tchecker::zg::transition_t,unsigned_long,1ul>> *this,
          uint *args,
          intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL>_>
          *args_1)

{
  undefined8 *puVar1;
  vedge_sptr_t *in_RCX;
  refcount_t *refcount;
  
  puVar1 = (undefined8 *)
           pool_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>::
           allocate((pool_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>
                     *)args);
  if (puVar1 == (undefined8 *)0x0) {
    *(undefined8 *)this = 0;
  }
  else {
    zg::transition_t::transition_t((transition_t *)(puVar1 + 1),*(sync_id_t *)&args_1->_t,in_RCX);
    *puVar1 = 0;
    *(undefined8 *)this = 0;
    intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>
    ::reset((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>
             *)this,(make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL> *)(puVar1 + 1));
  }
  return (intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>
          )(make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL> *)this;
}

Assistant:

tchecker::intrusive_shared_ptr_t<T> construct(ARGS &&... args)
  {
    void * t = allocate();
    if (t == nullptr)
      return tchecker::intrusive_shared_ptr_t<T>(nullptr);
    // p points after the reference counter
    void * p = static_cast<typename T::refcount_t *>(t) + 1;
    try {
      T::construct(p, std::forward<ARGS>(args)...); // construct T in p with args
    }
    catch (...) {
      this->release(t);
      throw;
    }
    return tchecker::intrusive_shared_ptr_t<T>(reinterpret_cast<T *>(p));
  }